

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O2

void QTestResult::addFailure(char *message,char *file,int line)

{
  long lVar1;
  long lVar2;
  QTestEventLoop *this;
  
  clearExpectFail();
  if (QCoreApplication::self != 0) {
    lVar1 = QThread::currentThread();
    lVar2 = QObject::thread();
    if (lVar1 == lVar2) {
      this = QTestEventLoop::instance();
      QTestEventLoop::exitLoop(this);
    }
  }
  if (QTest::blacklistCurrentTest == '\x01') {
    QTestLog::addBFail(message,file,line);
  }
  else {
    QTestLog::addFail(message,file,line);
  }
  QTest::setFailed(true);
  return;
}

Assistant:

void QTestResult::addFailure(const char *message, const char *file, int line)
{
    clearExpectFail();
    if (qApp && QThread::currentThread() == qApp->thread())
        QTestEventLoop::instance().exitLoop();

    if (QTest::blacklistCurrentTest)
        QTestLog::addBFail(message, file, line);
    else
        QTestLog::addFail(message, file, line);
    QTest::setFailed(true);
}